

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O3

char * deMemPool_strnDup(deMemPool *pool,char *str,int maxLength)

{
  size_t sVar1;
  char *__dest;
  int iVar2;
  
  sVar1 = strlen(str);
  iVar2 = 0;
  if (0 < maxLength) {
    iVar2 = maxLength;
  }
  if ((int)sVar1 < iVar2) {
    iVar2 = (int)sVar1;
  }
  sVar1 = (size_t)iVar2;
  __dest = (char *)deMemPool_alloc(pool,sVar1 + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,str,sVar1);
    __dest[sVar1] = '\0';
  }
  return __dest;
}

Assistant:

char* deMemPool_strnDup (deMemPool* pool, const char* str, int maxLength)
{
	size_t	len			= (size_t)deMin32((int)strlen(str), deMax32(0, maxLength));
	char*	newStr		= (char*)deMemPool_alloc(pool, len + 1);

	DE_ASSERT(maxLength >= 0);

	if (newStr)
	{
		memcpy(newStr, str, len);
		newStr[len] = 0;
	}
	return newStr;
}